

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UObject * __thiscall
icu_63::ICUService::getKey
          (ICUService *this,ICUServiceKey *key,UnicodeString *actualReturn,
          ICUServiceFactory *factory,UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  UBool UVar4;
  int iVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  Hashtable *pHVar7;
  ICUServiceFactory *pIVar8;
  long *plVar9;
  UObject *_service;
  CacheEntry *this_00;
  UVector *this_01;
  UnicodeString *pUVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  code *pcVar11;
  char *__filename;
  void *p;
  UnicodeString *local_1d0;
  UVector *local_1b8;
  CacheEntry *local_1a0;
  Hashtable *local_140;
  UObject *service_1;
  UnicodeString *desc;
  int32_t i_1;
  UnicodeString *idToCache;
  UObject *service;
  ICUServiceFactory *f;
  int32_t index;
  int32_t i;
  int iStack_c8;
  UBool cacheResult;
  int32_t limit;
  int32_t startIndex;
  UBool putInCache;
  UVectorDeleter cacheDescriptorList;
  UnicodeString currentDescriptor;
  undefined1 local_58 [8];
  XMutex mutex;
  CacheEntry *result;
  ICUService *ncthis;
  UErrorCode *status_local;
  ICUServiceFactory *factory_local;
  UnicodeString *actualReturn_local;
  ICUServiceKey *key_local;
  ICUService *this_local;
  
  UVar4 = ::U_FAILURE(*status);
  if (UVar4 != '\0') {
    return (UObject *)0x0;
  }
  iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xc])();
  if ((char)iVar5 != '\0') {
    iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x11])(this,key,actualReturn,status);
    return (UObject *)CONCAT44(extraout_var,iVar5);
  }
  mutex.fActive = '\0';
  mutex._9_7_ = 0;
  local_1d0 = (UnicodeString *)icu_63::lock;
  XMutex::XMutex((XMutex *)local_58,(UMutex *)icu_63::lock,factory != (ICUServiceFactory *)0x0);
  if (this->serviceCache == (Hashtable *)0x0) {
    pHVar7 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)local_1d0);
    local_140 = (Hashtable *)0x0;
    if (pHVar7 != (Hashtable *)0x0) {
      local_1d0 = (UnicodeString *)status;
      Hashtable::Hashtable(pHVar7,status);
      local_140 = pHVar7;
    }
    this->serviceCache = local_140;
    if (this->serviceCache == (Hashtable *)0x0) {
      this_local = (ICUService *)0x0;
      bVar1 = true;
      goto LAB_0035a73e;
    }
    UVar4 = ::U_FAILURE(*status);
    if (UVar4 != '\0') {
      pHVar7 = this->serviceCache;
      if (pHVar7 != (Hashtable *)0x0) {
        Hashtable::~Hashtable(pHVar7);
        UMemory::operator_delete((UMemory *)pHVar7,local_1d0);
      }
      this_local = (ICUService *)0x0;
      bVar1 = true;
      goto LAB_0035a73e;
    }
    pcVar11 = cacheDeleter;
    Hashtable::setValueDeleter(this->serviceCache,cacheDeleter);
    local_1d0 = (UnicodeString *)pcVar11;
  }
  UnicodeString::UnicodeString((UnicodeString *)&cacheDescriptorList);
  UVectorDeleter::UVectorDeleter((UVectorDeleter *)&startIndex);
  bVar2 = false;
  iStack_c8 = 0;
  iVar6 = UVector::size(this->factories);
  bVar1 = true;
  if (factory == (ICUServiceFactory *)0x0) {
LAB_00359fe1:
    do {
      UnicodeString::remove((UnicodeString *)&cacheDescriptorList,(char *)local_1d0);
      (*(key->super_UObject)._vptr_UObject[6])(key,&cacheDescriptorList);
      pcVar11 = (code *)&cacheDescriptorList;
      mutex._8_8_ = Hashtable::get(this->serviceCache,(UnicodeString *)pcVar11);
      if ((void *)mutex._8_8_ != (void *)0x0) break;
      bVar2 = true;
      f._0_4_ = iStack_c8;
      while ((int)f < iVar6) {
        plVar9 = (long *)UVector::elementAt(this->factories,(int)f);
        pcVar11 = (code *)key;
        _service = (UObject *)(**(code **)(*plVar9 + 0x18))(plVar9,key,this,status);
        UVar4 = ::U_FAILURE(*status);
        if (UVar4 != '\0') {
          if (_service != (UObject *)0x0) {
            (*_service->_vptr_UObject[1])();
          }
          this_local = (ICUService *)0x0;
          bVar1 = true;
          goto LAB_0035a726;
        }
        f._0_4_ = (int)f + 1;
        if (_service != (UObject *)0x0) {
          this_00 = (CacheEntry *)UMemory::operator_new((UMemory *)0x50,(size_t)pcVar11);
          local_1a0 = (CacheEntry *)0x0;
          if (this_00 != (CacheEntry *)0x0) {
            CacheEntry::CacheEntry(this_00,(UnicodeString *)&cacheDescriptorList,_service);
            local_1a0 = this_00;
          }
          mutex._8_8_ = local_1a0;
          if (local_1a0 != (CacheEntry *)0x0) goto LAB_0035a440;
          if (_service != (UObject *)0x0) {
            (*_service->_vptr_UObject[1])();
          }
          *status = U_MEMORY_ALLOCATION_ERROR;
          this_local = (ICUService *)0x0;
          bVar1 = true;
          goto LAB_0035a726;
        }
      }
      if (_startIndex == (UVector *)0x0) {
        this_01 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pcVar11);
        local_1b8 = (UVector *)0x0;
        if (this_01 != (UVector *)0x0) {
          pcVar11 = uprv_deleteUObject_63;
          UVector::UVector(this_01,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,5,status);
          local_1b8 = this_01;
        }
        _startIndex = local_1b8;
        UVar4 = ::U_FAILURE(*status);
        if (UVar4 != '\0') {
          this_local = (ICUService *)0x0;
          bVar1 = true;
          goto LAB_0035a726;
        }
      }
      pUVar10 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pcVar11);
      local_1d0 = (UnicodeString *)0x0;
      if (pUVar10 != (UnicodeString *)0x0) {
        UnicodeString::UnicodeString(pUVar10,(UnicodeString *)&cacheDescriptorList);
        local_1d0 = pUVar10;
      }
      if ((local_1d0 == (UnicodeString *)0x0) ||
         (UVar4 = UnicodeString::isBogus(local_1d0), UVar4 != '\0')) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        this_local = (ICUService *)0x0;
        bVar1 = true;
        goto LAB_0035a726;
      }
      UVector::addElement(_startIndex,local_1d0,status);
      UVar4 = ::U_FAILURE(*status);
      if (UVar4 != '\0') {
        this_local = (ICUService *)0x0;
        bVar1 = true;
        goto LAB_0035a726;
      }
      iVar5 = (*(key->super_UObject)._vptr_UObject[7])();
    } while ((char)iVar5 != '\0');
LAB_0035a440:
    if (mutex._8_8_ == 0) {
      bVar1 = false;
    }
    else {
      if ((bVar2) && (bVar1)) {
        Hashtable::put(this->serviceCache,(UnicodeString *)(mutex._8_8_ + 8),(void *)mutex._8_8_,
                       status);
        UVar4 = ::U_FAILURE(*status);
        if (UVar4 != '\0') {
          this_local = (ICUService *)0x0;
          bVar1 = true;
          goto LAB_0035a726;
        }
        if (_startIndex != (UVector *)0x0) {
          desc._0_4_ = UVector::size(_startIndex);
          while (desc._0_4_ = (int32_t)desc + -1, -1 < (int32_t)desc) {
            pUVar10 = (UnicodeString *)UVector::elementAt(_startIndex,(int32_t)desc);
            Hashtable::put(this->serviceCache,pUVar10,(void *)mutex._8_8_,status);
            UVar4 = ::U_FAILURE(*status);
            if (UVar4 != '\0') {
              this_local = (ICUService *)0x0;
              bVar1 = true;
              goto LAB_0035a726;
            }
            CacheEntry::ref((CacheEntry *)mutex._8_8_);
            UVector::removeElementAt(_startIndex,(int32_t)desc);
          }
        }
      }
      if (actualReturn != (UnicodeString *)0x0) {
        __filename = (char *)0x2f;
        iVar6 = UnicodeString::indexOf((UnicodeString *)(mutex._8_8_ + 8),L'/');
        if (iVar6 == 0) {
          UnicodeString::remove(actualReturn,__filename);
          pUVar10 = (UnicodeString *)(mutex._8_8_ + 8);
          iVar6 = UnicodeString::length(pUVar10);
          UnicodeString::append(actualReturn,pUVar10,1,iVar6 + -1);
        }
        else {
          pUVar10 = (UnicodeString *)(mutex._8_8_ + 8);
          UnicodeString::operator=(actualReturn,pUVar10);
        }
        UVar4 = UnicodeString::isBogus(actualReturn);
        uVar3 = mutex._8_8_;
        if (UVar4 != '\0') {
          *status = U_MEMORY_ALLOCATION_ERROR;
          if (mutex._8_8_ != 0) {
            CacheEntry::~CacheEntry((CacheEntry *)mutex._8_8_);
            UMemory::operator_delete((UMemory *)uVar3,pUVar10);
          }
          this_local = (ICUService *)0x0;
          bVar1 = true;
          goto LAB_0035a726;
        }
      }
      p = *(void **)(mutex._8_8_ + 0x48);
      iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xe])();
      uVar3 = mutex._8_8_;
      this_local = (ICUService *)CONCAT44(extraout_var_00,iVar5);
      if (((bVar2) && (!bVar1)) && (mutex._8_8_ != 0)) {
        CacheEntry::~CacheEntry((CacheEntry *)mutex._8_8_);
        UMemory::operator_delete((UMemory *)uVar3,p);
      }
      bVar1 = true;
    }
  }
  else {
    for (f._4_4_ = 0; (int)f._4_4_ < iVar6; f._4_4_ = f._4_4_ + 1) {
      local_1d0 = (UnicodeString *)(ulong)f._4_4_;
      pIVar8 = (ICUServiceFactory *)UVector::elementAt(this->factories,f._4_4_);
      if (factory == pIVar8) {
        iStack_c8 = f._4_4_ + 1;
        break;
      }
    }
    if (iStack_c8 != 0) {
      bVar1 = false;
      goto LAB_00359fe1;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    this_local = (ICUService *)0x0;
    bVar1 = true;
  }
LAB_0035a726:
  UVectorDeleter::~UVectorDeleter((UVectorDeleter *)&startIndex);
  UnicodeString::~UnicodeString((UnicodeString *)&cacheDescriptorList);
LAB_0035a73e:
  XMutex::~XMutex((XMutex *)local_58);
  if (!bVar1) {
    iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x11])(this,key,actualReturn,status);
    this_local = (ICUService *)CONCAT44(extraout_var_01,iVar5);
  }
  return (UObject *)this_local;
}

Assistant:

UObject* 
ICUService::getKey(ICUServiceKey& key, UnicodeString* actualReturn, const ICUServiceFactory* factory, UErrorCode& status) const 
{
    if (U_FAILURE(status)) {
        return NULL;
    }

    if (isDefault()) {
        return handleDefault(key, actualReturn, status);
    }

    ICUService* ncthis = (ICUService*)this; // cast away semantic const

    CacheEntry* result = NULL;
    {
        // The factory list can't be modified until we're done, 
        // otherwise we might update the cache with an invalid result.
        // The cache has to stay in synch with the factory list.
        // ICU doesn't have monitors so we can't use rw locks, so 
        // we single-thread everything using this service, for now.

        // if factory is not null, we're calling from within the mutex,
        // and since some unix machines don't have reentrant mutexes we
        // need to make sure not to try to lock it again.
        XMutex mutex(&lock, factory != NULL);

        if (serviceCache == NULL) {
            ncthis->serviceCache = new Hashtable(status);
            if (ncthis->serviceCache == NULL) {
                return NULL;
            }
            if (U_FAILURE(status)) {
                delete serviceCache;
                return NULL;
            }
            serviceCache->setValueDeleter(cacheDeleter);
        }

        UnicodeString currentDescriptor;
        UVectorDeleter cacheDescriptorList;
        UBool putInCache = FALSE;

        int32_t startIndex = 0;
        int32_t limit = factories->size();
        UBool cacheResult = TRUE;

        if (factory != NULL) {
            for (int32_t i = 0; i < limit; ++i) {
                if (factory == (const ICUServiceFactory*)factories->elementAt(i)) {
                    startIndex = i + 1;
                    break;
                }
            }
            if (startIndex == 0) {
                // throw new InternalError("Factory " + factory + "not registered with service: " + this);
                status = U_ILLEGAL_ARGUMENT_ERROR;
                return NULL;
            }
            cacheResult = FALSE;
        }

        do {
            currentDescriptor.remove();
            key.currentDescriptor(currentDescriptor);
            result = (CacheEntry*)serviceCache->get(currentDescriptor);
            if (result != NULL) {
                break;
            }

            // first test of cache failed, so we'll have to update
            // the cache if we eventually succeed-- that is, if we're 
            // going to update the cache at all.
            putInCache = TRUE;

            int32_t index = startIndex;
            while (index < limit) {
                ICUServiceFactory* f = (ICUServiceFactory*)factories->elementAt(index++);
                UObject* service = f->create(key, this, status);
                if (U_FAILURE(status)) {
                    delete service;
                    return NULL;
                }
                if (service != NULL) {
                    result = new CacheEntry(currentDescriptor, service);
                    if (result == NULL) {
                        delete service;
                        status = U_MEMORY_ALLOCATION_ERROR;
                        return NULL;
                    }

                    goto outerEnd;
                }
            }

            // prepare to load the cache with all additional ids that 
            // will resolve to result, assuming we'll succeed.  We
            // don't want to keep querying on an id that's going to
            // fallback to the one that succeeded, we want to hit the
            // cache the first time next goaround.
            if (cacheDescriptorList._obj == NULL) {
                cacheDescriptorList._obj = new UVector(uprv_deleteUObject, NULL, 5, status);
                if (U_FAILURE(status)) {
                    return NULL;
                }
            }
            UnicodeString* idToCache = new UnicodeString(currentDescriptor);
            if (idToCache == NULL || idToCache->isBogus()) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return NULL;
            }

            cacheDescriptorList._obj->addElement(idToCache, status);
            if (U_FAILURE(status)) {
                return NULL;
            }
        } while (key.fallback());
outerEnd:

        if (result != NULL) {
            if (putInCache && cacheResult) {
                serviceCache->put(result->actualDescriptor, result, status);
                if (U_FAILURE(status)) {
                    return NULL;
                }

                if (cacheDescriptorList._obj != NULL) {
                    for (int32_t i = cacheDescriptorList._obj->size(); --i >= 0;) {
                        UnicodeString* desc = (UnicodeString*)cacheDescriptorList._obj->elementAt(i);

                        serviceCache->put(*desc, result, status);
                        if (U_FAILURE(status)) {
                            return NULL;
                        }

                        result->ref();
                        cacheDescriptorList._obj->removeElementAt(i);
                    }
                }
            }

            if (actualReturn != NULL) {
                // strip null prefix
                if (result->actualDescriptor.indexOf((UChar)0x2f) == 0) { // U+002f=slash (/)
                    actualReturn->remove();
                    actualReturn->append(result->actualDescriptor, 
                        1, 
                        result->actualDescriptor.length() - 1);
                } else {
                    *actualReturn = result->actualDescriptor;
                }

                if (actualReturn->isBogus()) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    delete result;
                    return NULL;
                }
            }

            UObject* service = cloneInstance(result->service);
            if (putInCache && !cacheResult) {
                delete result;
            }
            return service;
        }
    }

    return handleDefault(key, actualReturn, status);
}